

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

optional<unsigned_long_long> __thiscall QMetaEnum::keyToValue64(QMetaEnum *this,char *key)

{
  bool bVar1;
  qsizetype qVar2;
  QByteArrayView *pQVar3;
  _Storage<unsigned_long_long,_true> _Var4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  uint index;
  int iVar6;
  long in_FS_OFFSET;
  QByteArrayView qualifiedKey;
  optional<unsigned_long_long> oVar7;
  optional<QByteArrayView> scope;
  QByteArrayView local_78;
  _Storage<QByteArrayView,_true> local_68;
  undefined1 *local_58;
  QByteArrayView QStack_50;
  _Storage<unsigned_long_long,_true> local_38;
  
  _Var4 = (_Storage<unsigned_long_long,_true>)
          ((_Storage<unsigned_long_long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  uVar5 = 0;
  local_38 = _Var4;
  if (key != (char *)0x0) {
    if (this->mobj == (QMetaObject *)0x0) goto LAB_00262a2f;
    QStack_50.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QStack_50.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68._M_value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68._M_value.m_data = &DAT_aaaaaaaaaaaaaaaa;
    qVar2 = QtPrivate::lengthHelperPointer<char>(key);
    qualifiedKey.m_data = key;
    qualifiedKey.m_size = qVar2;
    parse_scope((R_conflict6 *)&local_68._M_value,qualifiedKey);
    iVar6 = 0;
    for (index = 0; _Var4 = (_Storage<unsigned_long_long,_true>)(this->data).d,
        (int)index < (int)*(uint *)(_Var4._M_value + 0xc); index = index + 1) {
      if ((char)local_58 == '\x01') {
        pQVar3 = std::
                 _Optional_base_impl<QByteArrayView,_std::_Optional_base<QByteArrayView,_true,_true>_>
                 ::_M_get((_Optional_base_impl<QByteArrayView,_std::_Optional_base<QByteArrayView,_true,_true>_>
                           *)&local_68._M_value);
        bVar1 = isScopeMatch(*pQVar3,this);
        if (bVar1) {
          _Var4 = (_Storage<unsigned_long_long,_true>)(this->data).d;
          goto LAB_002629ea;
        }
      }
      else {
LAB_002629ea:
        local_78 = stringDataView(this->mobj,
                                  (this->mobj->d).data[*(uint *)(_Var4._M_value + 0x10) + iVar6]);
        bVar1 = ::comparesEqual(&QStack_50,&local_78);
        if (bVar1) {
          _Var4._M_value = value_helper<>(this,index);
          uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          goto LAB_00262a2f;
        }
      }
      iVar6 = iVar6 + 2;
    }
  }
  uVar5 = 0;
LAB_00262a2f:
  if (*(uint **)(in_FS_OFFSET + 0x28) != (uint *)local_38._M_value) {
    __stack_chk_fail();
  }
  oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._8_8_ = uVar5;
  oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = _Var4._M_value;
  return (optional<unsigned_long_long>)
         oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::keyToValue64(const char *key) const
{
    if (!mobj || !key)
        return std::nullopt;
    const auto [scope, enumKey] = parse_scope(QLatin1StringView(key));
    for (int i = 0; i < int(data.keyCount()); ++i) {
        if ((!scope || isScopeMatch(*scope, this))
            && enumKey == stringDataView(mobj, mobj->d.data[data.data() + 2 * i])) {
            return value_helper(i);
        }
    }
    return std::nullopt;
}